

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::CloseCurrentPopup(void)

{
  int iVar1;
  int iVar2;
  ImGuiPopupData *pIVar3;
  bool bVar4;
  ImGuiContext *pIVar5;
  uint remaining;
  
  pIVar5 = GImGui;
  iVar1 = (GImGui->BeginPopupStack).Size;
  if ((0 < iVar1) && (iVar2 = (GImGui->OpenPopupStack).Size, iVar1 <= iVar2)) {
    remaining = iVar1 - 1;
    pIVar3 = (GImGui->OpenPopupStack).Data;
    if ((GImGui->BeginPopupStack).Data[remaining].PopupId == pIVar3[remaining].PopupId) {
      do {
        if ((int)remaining < 1) {
          remaining = 0;
          break;
        }
        if (iVar2 <= (int)remaining) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                        ,0x5c2,"T &ImVector<ImGuiPopupData>::operator[](int) [T = ImGuiPopupData]");
        }
        if ((pIVar3[remaining].Window == (ImGuiWindow *)0x0) ||
           (((pIVar3[remaining].Window)->Flags & 0x10000000) == 0)) {
LAB_001377d7:
          bVar4 = false;
        }
        else {
          if ((pIVar3[remaining - 1].Window != (ImGuiWindow *)0x0) &&
             (((pIVar3[remaining - 1].Window)->Flags & 0x8000000) != 0)) goto LAB_001377d7;
          bVar4 = true;
          remaining = remaining - 1;
        }
      } while (bVar4);
      ClosePopupToLevel(remaining,true);
      if (pIVar5->NavWindow != (ImGuiWindow *)0x0) {
        (pIVar5->NavWindow->DC).NavHideHighlightOneFrame = true;
      }
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.BeginPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.BeginPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;

    // Closing a menu closes its top-most parent popup (unless a modal)
    while (popup_idx > 0)
    {
        ImGuiWindow* popup_window = g.OpenPopupStack[popup_idx].Window;
        ImGuiWindow* parent_popup_window = g.OpenPopupStack[popup_idx - 1].Window;
        bool close_parent = false;
        if (popup_window && (popup_window->Flags & ImGuiWindowFlags_ChildMenu))
            if (parent_popup_window == NULL || !(parent_popup_window->Flags & ImGuiWindowFlags_Modal))
                close_parent = true;
        if (!close_parent)
            break;
        popup_idx--;
    }
    IMGUI_DEBUG_LOG_POPUP("CloseCurrentPopup %d -> %d\n", g.BeginPopupStack.Size - 1, popup_idx);
    ClosePopupToLevel(popup_idx, true);

    // A common pattern is to close a popup when selecting a menu item/selectable that will open another window.
    // To improve this usage pattern, we avoid nav highlight for a single frame in the parent window.
    // Similarly, we could avoid mouse hover highlight in this window but it is less visually problematic.
    if (ImGuiWindow* window = g.NavWindow)
        window->DC.NavHideHighlightOneFrame = true;
}